

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListDatatypeValidator.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::ListDatatypeValidator::valueSpaceCheck
          (ListDatatypeValidator *this,BaseRefVectorOf<char16_t> *tokenVector,XMLCh *enumStr,
          MemoryManager *manager)

{
  int iVar1;
  DatatypeValidator *pDVar2;
  BaseRefVectorOf<char16_t> *this_00;
  char16_t *pcVar3;
  char16_t *pcVar4;
  uint uVar5;
  ulong getAt;
  bool bVar6;
  
  pDVar2 = getItemTypeDTV(this);
  this_00 = XMLString::tokenizeString(enumStr,manager);
  uVar5 = 0;
  bVar6 = false;
  if (tokenVector->fCurCount == this_00->fCurCount) {
    do {
      getAt = (ulong)uVar5;
      bVar6 = tokenVector->fCurCount <= getAt;
      if (tokenVector->fCurCount <= getAt) break;
      pcVar3 = BaseRefVectorOf<char16_t>::elementAt(tokenVector,getAt);
      pcVar4 = BaseRefVectorOf<char16_t>::elementAt(this_00,getAt);
      iVar1 = (*(pDVar2->super_XSerializable)._vptr_XSerializable[10])(pDVar2,pcVar3,pcVar4,manager)
      ;
      uVar5 = uVar5 + 1;
    } while (iVar1 == 0);
    if (this_00 == (BaseRefVectorOf<char16_t> *)0x0) {
      return bVar6;
    }
  }
  (*this_00->_vptr_BaseRefVectorOf[1])(this_00);
  return bVar6;
}

Assistant:

bool ListDatatypeValidator::valueSpaceCheck(BaseRefVectorOf<XMLCh>* tokenVector
                                          , const XMLCh*    const  enumStr
                                          , MemoryManager*  const  manager) const
{
    DatatypeValidator* theItemTypeDTV = getItemTypeDTV();
    BaseRefVectorOf<XMLCh>* enumVector = XMLString::tokenizeString(enumStr, manager);
    Janitor<BaseRefVectorOf<XMLCh> > janName(enumVector);

    if (tokenVector->size() != enumVector->size())
        return false;

    for ( unsigned int j = 0; j < tokenVector->size(); j++ )
    {
        if (theItemTypeDTV->compare(tokenVector->elementAt(j), enumVector->elementAt(j), manager) != 0)
            return false;
    }

    return true;
}